

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O0

void anon_unknown.dwarf_71760::TextRegBits<(anonymous_namespace)::IntArg>
               (Emulator *e,u8 v,BitArg arg,IntArg args)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  undefined8 in_R8;
  IntArg arg_00;
  char *local_68;
  char *text;
  bool is_set;
  u8 masked;
  u8 v_local;
  Emulator *e_local;
  IntArg args_local;
  
  arg_00.text = args._8_8_;
  bVar1 = v & arg.mask;
  if (((undefined1  [40])arg & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
    bVar1 = (bVar1 != 0 ^ 0xffU) & 1;
  }
  if (bVar1 == 0) {
    local_68 = arg.false_text;
  }
  else {
    local_68 = arg.true_text;
  }
  sVar3 = strlen(local_68);
  if (sVar3 != 0) {
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("%s",local_68);
    if ((arg.tooltip != (char *)0x0) && (bVar2 = ImGui::IsItemHovered(0), bVar2)) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  arg_00.mask = (char)in_R8;
  arg_00._9_3_ = (int3)((ulong)in_R8 >> 8);
  arg_00.shift = (int)((ulong)in_R8 >> 0x20);
  TextRegBits<>((anon_unknown_dwarf_71760 *)e,(Emulator *)(ulong)v,(u8)args.text,arg_00);
  return;
}

Assistant:

void TextRegBits(Emulator* e, u8 v, BitArg arg, Args... args) {
  u8 masked = v & arg.mask;
  bool is_set = arg.invert ? !masked : masked;
  const char* text = is_set ? arg.true_text : arg.false_text;
  if (strlen(text) != 0) {
    ImGui::SameLine();
    ImGui::Text("%s", text);
    if (arg.tooltip && ImGui::IsItemHovered()) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  TextRegBits(e, v, args...);
}